

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t scan_for_signature(archive_read *a)

{
  wchar_t wVar1;
  long local_38;
  char signature [8];
  ssize_t i;
  uint8_t *puStack_20;
  wchar_t chunk_size;
  uint8_t *p;
  archive_read *a_local;
  
  p = (uint8_t *)a;
  rar5_signature((char *)&local_38);
  do {
    wVar1 = read_ahead((archive_read *)p,0x200,&stack0xffffffffffffffe0);
    if (wVar1 == L'\0') {
      return L'\x01';
    }
    signature[0] = '\0';
    signature[1] = '\0';
    signature[2] = '\0';
    signature[3] = '\0';
    signature[4] = '\0';
    signature[5] = '\0';
    signature[6] = '\0';
    signature[7] = '\0';
    for (; (long)signature < 0x1f8; signature = (char  [8])((long)signature + 1)) {
      if (*(long *)(puStack_20 + (long)signature) == local_38) {
        consume((archive_read *)p,(long)signature + 8);
        return L'\0';
      }
    }
    consume((archive_read *)p,0x200);
  } while( true );
}

Assistant:

static int scan_for_signature(struct archive_read* a) {
	const uint8_t* p;
	const int chunk_size = 512;
	ssize_t i;
	char signature[sizeof(rar5_signature_xor)];

	/* If we're here, it means we're on an 'unknown territory' data.
	 * There's no indication what kind of data we're reading here.
	 * It could be some text comment, any kind of binary data,
	 * digital sign, dragons, etc.
	 *
	 * We want to find a valid RARv5 magic header inside this unknown
	 * data. */

	/* Is it possible in libarchive to just skip everything until the
	 * end of the file? If so, it would be a better approach than the
	 * current implementation of this function. */

	rar5_signature(signature);

	while(1) {
		if(!read_ahead(a, chunk_size, &p))
			return ARCHIVE_EOF;

		for(i = 0; i < chunk_size - (int)sizeof(rar5_signature_xor);
		    i++) {
			if(memcmp(&p[i], signature,
			    sizeof(rar5_signature_xor)) == 0) {
				/* Consume the number of bytes we've used to
				 * search for the signature, as well as the
				 * number of bytes used by the signature
				 * itself. After this we should be standing
				 * on a valid base block header. */
				(void) consume(a,
				    i + sizeof(rar5_signature_xor));
				return ARCHIVE_OK;
			}
		}

		consume(a, chunk_size);
	}

	return ARCHIVE_FATAL;
}